

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int cmfgkb_(int *lot,int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *im1,
           int *in1,double *ch,double *ch1,int *im2,int *in2,double *wa)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  ulong uVar46;
  int iVar47;
  int iVar48;
  ulong uVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  long lVar53;
  int local_168;
  int local_d4;
  int local_40;
  ulong uVar15;
  
  iVar25 = *ido;
  lVar45 = (long)iVar25;
  iVar30 = *ip;
  uVar23 = ~(iVar30 * iVar25);
  iVar41 = *in1;
  iVar29 = *lid;
  iVar47 = iVar29 + 1;
  iVar6 = iVar41 * 2;
  iVar33 = -3 - iVar6 * iVar47;
  iVar40 = *l1;
  uVar10 = iVar40 * (iVar30 + 1);
  iVar16 = ~uVar10 * iVar6 + -3;
  iVar20 = *in2;
  iVar34 = iVar20 * iVar47;
  iVar24 = iVar34 * -2 + -3;
  iVar31 = ~((iVar25 + 1) * iVar40) * iVar20 * 2 + -3;
  iVar5 = *im1;
  lVar38 = (long)iVar5;
  lVar21 = ((long)*lot + -1) * lVar38;
  lVar1 = lVar21 + 1;
  lVar21 = (long)(int)lVar21;
  iVar11 = 0;
  if (0 < iVar29) {
    iVar11 = iVar29;
  }
  uVar15 = (ulong)(iVar11 + 1);
  iVar11 = *im2 * 2;
  iVar47 = iVar47 * iVar41;
  iVar35 = iVar34 * 2 + 2;
  iVar7 = iVar20 * 2;
  iVar42 = iVar47 * 2 + 2;
  for (uVar49 = 1; uVar49 != uVar15; uVar49 = uVar49 + 1) {
    lVar53 = 1;
    iVar17 = iVar35;
    iVar50 = iVar42;
    while( true ) {
      bVar9 = lVar53 <= lVar1;
      if (iVar5 < 0) {
        bVar9 = lVar21 < lVar53;
      }
      if (!bVar9) break;
      ch1[(long)iVar24 + (long)(iVar17 + 1)] = cc1[(long)iVar33 + (long)(iVar50 + 1)];
      ch1[(long)iVar24 + (long)iVar17 + 2] = cc1[(long)iVar33 + (long)iVar50 + 2];
      lVar53 = lVar53 + lVar38;
      iVar17 = iVar17 + iVar11;
      iVar50 = iVar50 + iVar5 * 2;
    }
    iVar35 = iVar35 + iVar7;
    iVar42 = iVar42 + iVar6;
  }
  iVar12 = iVar30 + -1;
  iVar13 = (iVar30 + 1) / 2;
  lVar53 = (long)iVar13;
  iVar35 = iVar29 * iVar30 + 1;
  iVar17 = iVar20 * iVar35 * 2;
  iVar18 = iVar20 * iVar29;
  iVar50 = iVar18 * 2;
  iVar42 = iVar29 * 2 + 1;
  iVar44 = iVar20 * iVar42 * 2;
  iVar35 = iVar35 * iVar41 * 2 + 2;
  iVar14 = iVar41 * iVar29;
  iVar8 = iVar14 * 2;
  iVar42 = iVar42 * iVar41 * 2 + 2;
  for (lVar26 = 2; lVar26 <= lVar53; lVar26 = lVar26 + 1) {
    iVar28 = iVar17;
    iVar39 = iVar44;
    iVar19 = iVar42;
    iVar37 = iVar35;
    for (uVar49 = 1; uVar49 != uVar15; uVar49 = uVar49 + 1) {
      iVar51 = 0;
      lVar22 = 1;
      iVar36 = iVar37;
      iVar43 = iVar19;
      while( true ) {
        bVar9 = lVar22 <= lVar1;
        if (iVar5 < 0) {
          bVar9 = lVar21 < lVar22;
        }
        if (!bVar9) break;
        ch1[(long)iVar24 + (long)(iVar39 + 3 + iVar51)] =
             cc1[(long)iVar33 + (long)(iVar43 + 1)] + cc1[(long)iVar33 + (long)(iVar36 + 1)];
        ch1[(long)iVar24 + (long)(iVar28 + 3 + iVar51)] =
             cc1[(long)iVar33 + (long)(iVar43 + 1)] - cc1[(long)iVar33 + (long)(iVar36 + 1)];
        ch1[(long)iVar24 + (long)(iVar39 + 2 + iVar51) + 2] =
             cc1[(long)iVar33 + (long)iVar43 + 2] + cc1[(long)iVar33 + (long)iVar36 + 2];
        ch1[(long)iVar24 + (long)(iVar28 + 2 + iVar51) + 2] =
             cc1[(long)iVar33 + (long)iVar43 + 2] - cc1[(long)iVar33 + (long)iVar36 + 2];
        lVar22 = lVar22 + lVar38;
        iVar51 = iVar51 + iVar11;
        iVar36 = iVar36 + iVar5 * 2;
        iVar43 = iVar43 + iVar5 * 2;
      }
      iVar28 = iVar28 + iVar7;
      iVar39 = iVar39 + iVar7;
      iVar37 = iVar37 + iVar6;
      iVar19 = iVar19 + iVar6;
    }
    iVar17 = iVar17 + iVar18 * -2;
    iVar44 = iVar44 + iVar50;
    iVar35 = iVar35 + iVar14 * -2;
    iVar42 = iVar42 + iVar8;
  }
  iVar35 = (iVar29 * 2 + 1) * iVar20 * 2 + 2;
  for (lVar26 = 2; lVar26 <= lVar53; lVar26 = lVar26 + 1) {
    iVar17 = iVar47 * 2 + 2;
    iVar42 = iVar35;
    for (uVar49 = 1; uVar49 != uVar15; uVar49 = uVar49 + 1) {
      lVar22 = 1;
      iVar44 = iVar17;
      iVar39 = iVar42;
      while( true ) {
        bVar9 = lVar22 <= lVar1;
        if (iVar5 < 0) {
          bVar9 = lVar21 < lVar22;
        }
        if (!bVar9) break;
        cc1[(long)iVar33 + (long)(iVar44 + 1)] =
             ch1[(long)iVar24 + (long)(iVar39 + 1)] + cc1[(long)iVar33 + (long)(iVar44 + 1)];
        cc1[(long)iVar33 + (long)iVar44 + 2] =
             ch1[(long)iVar24 + (long)iVar39 + 2] + cc1[(long)iVar33 + (long)iVar44 + 2];
        lVar22 = lVar22 + lVar38;
        iVar39 = iVar39 + iVar11;
        iVar44 = iVar44 + iVar5 * 2;
      }
      iVar42 = iVar42 + iVar7;
      iVar17 = iVar17 + iVar6;
    }
    iVar35 = iVar35 + iVar50;
  }
  iVar39 = iVar12 * 2;
  iVar35 = iVar29 * iVar30 + 1;
  iVar17 = iVar20 * iVar35 * 2;
  iVar19 = iVar29 * 2 + 1;
  iVar44 = iVar20 * iVar19 * 2;
  iVar35 = iVar35 * iVar41 * 2 + 2;
  iVar42 = iVar5 * 2;
  local_d4 = iVar19 * iVar41 * 2 + 2;
  for (lVar26 = 2; lVar26 <= lVar53; lVar26 = lVar26 + 1) {
    local_40 = (int)lVar26 + -1;
    lVar27 = (lVar26 + iVar12 + -1) * lVar45;
    lVar22 = (lVar26 + iVar39 + -1) * lVar45;
    iVar28 = 0;
    iVar19 = local_d4;
    iVar37 = iVar35;
    for (uVar49 = 1; uVar49 != uVar15; uVar49 = uVar49 + 1) {
      lVar32 = 1;
      iVar51 = iVar19;
      iVar36 = iVar28;
      iVar43 = iVar37;
      while( true ) {
        bVar9 = lVar32 <= lVar1;
        if (iVar5 < 0) {
          bVar9 = lVar21 < lVar32;
        }
        if (!bVar9) break;
        cc1[(long)iVar33 + (long)(iVar51 + 1)] =
             wa[(long)(int)uVar23 + lVar27 + 1] * ch1[(long)iVar24 + (long)(iVar44 + iVar36 + 3)] +
             ch1[(long)iVar24 + (long)(iVar34 * 2 + 3 + iVar36)];
        cc1[(long)iVar33 + (long)(iVar43 + 1)] =
             wa[(long)(int)uVar23 + lVar22 + 1] * ch1[(long)iVar24 + (long)(iVar17 + 3 + iVar36)];
        cc1[(long)iVar33 + (long)iVar51 + 2] =
             wa[(long)(int)uVar23 + lVar27 + 1] *
             ch1[(long)iVar24 + (long)(iVar44 + 2 + iVar36) + 2] +
             ch1[(long)iVar24 + (long)(iVar34 * 2 + 2 + iVar36) + 2];
        cc1[(long)iVar33 + (long)iVar43 + 2] =
             wa[(long)(int)uVar23 + lVar22 + 1] *
             ch1[(long)iVar24 + (long)(iVar17 + 2 + iVar36) + 2];
        lVar32 = lVar32 + lVar38;
        iVar36 = iVar36 + iVar11;
        iVar43 = iVar43 + iVar42;
        iVar51 = iVar51 + iVar42;
      }
      iVar28 = iVar28 + iVar7;
      iVar37 = iVar37 + iVar6;
      iVar19 = iVar19 + iVar6;
    }
    iVar19 = (iVar29 * 3 + 1) * iVar20 * 2;
    local_168 = (iVar12 * iVar29 + 1) * iVar20 * 2;
    for (uVar49 = 3; uVar49 != iVar13 + 1; uVar49 = uVar49 + 1) {
      iVar37 = (((int)uVar49 + -1) * local_40) % iVar30;
      dVar2 = wa[(long)(int)uVar23 + (long)((iVar12 + iVar37) * iVar25) + 1];
      dVar3 = wa[(long)(int)uVar23 + (long)((iVar37 + iVar39) * iVar25) + 1];
      iVar28 = local_d4;
      iVar36 = iVar35;
      iVar43 = local_168;
      iVar37 = iVar19;
      for (uVar46 = 1; uVar46 != uVar15; uVar46 = uVar46 + 1) {
        iVar48 = 0;
        lVar22 = 1;
        iVar51 = iVar28;
        iVar52 = iVar36;
        while( true ) {
          bVar9 = lVar22 <= lVar1;
          if (iVar5 < 0) {
            bVar9 = lVar21 < lVar22;
          }
          if (!bVar9) break;
          cc1[(long)iVar33 + (long)(iVar51 + 1)] =
               ch1[(long)iVar24 + (long)(iVar37 + 3 + iVar48)] * dVar2 +
               cc1[(long)iVar33 + (long)(iVar51 + 1)];
          cc1[(long)iVar33 + (long)(iVar52 + 1)] =
               ch1[(long)iVar24 + (long)(iVar43 + 3 + iVar48)] * dVar3 +
               cc1[(long)iVar33 + (long)(iVar52 + 1)];
          cc1[(long)iVar33 + (long)iVar51 + 2] =
               ch1[(long)iVar24 + (long)(iVar37 + iVar48 + 2) + 2] * dVar2 +
               cc1[(long)iVar33 + (long)iVar51 + 2];
          cc1[(long)iVar33 + (long)iVar52 + 2] =
               ch1[(long)iVar24 + (long)(iVar43 + 2 + iVar48) + 2] * dVar3 +
               cc1[(long)iVar33 + (long)iVar52 + 2];
          lVar22 = lVar22 + lVar38;
          iVar48 = iVar48 + iVar11;
          iVar52 = iVar52 + iVar42;
          iVar51 = iVar51 + iVar42;
        }
        iVar43 = iVar43 + iVar7;
        iVar37 = iVar37 + iVar7;
        iVar36 = iVar36 + iVar6;
        iVar28 = iVar28 + iVar6;
      }
      local_168 = local_168 + iVar18 * -2;
      iVar19 = iVar19 + iVar50;
    }
    iVar35 = iVar35 + iVar14 * -2;
    local_d4 = local_d4 + iVar8;
  }
  if ((iVar25 < 2) && (*na != 1)) {
    iVar31 = (iVar30 * iVar29 + 1) * iVar41 * 2 + 3;
    iVar25 = (iVar29 * 2 + 1) * iVar41 * 2 + 2;
    for (lVar45 = 2; lVar45 <= lVar53; lVar45 = lVar45 + 1) {
      iVar30 = iVar31;
      iVar41 = iVar25;
      for (uVar49 = 1; uVar49 != uVar15; uVar49 = uVar49 + 1) {
        lVar26 = 1;
        iVar29 = iVar30;
        iVar40 = iVar41;
        while( true ) {
          bVar9 = lVar26 <= lVar1;
          if (iVar5 < 0) {
            bVar9 = lVar21 < lVar26;
          }
          if (!bVar9) break;
          dVar2 = cc1[(long)iVar33 + (long)(iVar40 + 1)];
          dVar3 = cc1[(long)iVar33 + (long)(iVar29 + -1) + 2];
          cc1[(long)iVar33 + (long)(iVar40 + 1)] = dVar2 - dVar3;
          lVar22 = (long)iVar40;
          dVar4 = cc1[(long)iVar33 + (long)iVar29];
          cc1[(long)iVar33 + (long)(iVar29 + -1) + 2] = cc1[(long)iVar33 + lVar22 + 2] - dVar4;
          cc1[(long)iVar33 + lVar22 + 2] = dVar4 + cc1[(long)iVar33 + lVar22 + 2];
          cc1[(long)iVar33 + (long)iVar29] = dVar2 + dVar3;
          lVar26 = lVar26 + lVar38;
          iVar29 = iVar29 + iVar5 * 2;
          iVar40 = iVar40 + iVar5 * 2;
        }
        iVar30 = iVar30 + iVar6;
        iVar41 = iVar41 + iVar6;
      }
      iVar31 = iVar31 + iVar14 * -2;
      iVar25 = iVar25 + iVar8;
    }
  }
  else {
    iVar34 = iVar34 * 2 + 2;
    iVar47 = iVar47 * 2 + 2;
    for (uVar49 = 1; uVar49 != uVar15; uVar49 = uVar49 + 1) {
      lVar26 = 1;
      iVar35 = iVar34;
      iVar42 = iVar47;
      while( true ) {
        bVar9 = lVar26 <= lVar1;
        if (iVar5 < 0) {
          bVar9 = lVar21 < lVar26;
        }
        if (!bVar9) break;
        ch1[(long)iVar24 + (long)(iVar35 + 1)] = cc1[(long)iVar33 + (long)(iVar42 + 1)];
        ch1[(long)iVar24 + (long)iVar35 + 2] = cc1[(long)iVar33 + (long)iVar42 + 2];
        lVar26 = lVar26 + lVar38;
        iVar35 = iVar35 + iVar11;
        iVar42 = iVar42 + iVar5 * 2;
      }
      iVar34 = iVar34 + iVar7;
      iVar47 = iVar47 + iVar6;
    }
    iVar34 = iVar30 * iVar29 + 1;
    iVar47 = iVar20 * iVar34 * 2;
    iVar42 = iVar29 * 2 + 1;
    iVar35 = iVar20 * iVar42 * 2;
    iVar29 = iVar34 * iVar41 * 2 + 3;
    iVar34 = iVar42 * iVar41 * 2 + 2;
    for (lVar26 = 2; lVar26 <= lVar53; lVar26 = lVar26 + 1) {
      iVar42 = iVar47;
      iVar17 = iVar34;
      iVar44 = iVar29;
      iVar13 = iVar35;
      for (uVar49 = 1; uVar49 != uVar15; uVar49 = uVar49 + 1) {
        iVar28 = 0;
        lVar22 = 1;
        iVar19 = iVar17;
        iVar37 = iVar44;
        while( true ) {
          bVar9 = lVar22 <= lVar1;
          if (iVar5 < 0) {
            bVar9 = lVar21 < lVar22;
          }
          if (!bVar9) break;
          ch1[(long)iVar24 + (long)(iVar13 + 3 + iVar28)] =
               cc1[(long)iVar33 + (long)(iVar19 + 1)] - cc1[(long)iVar33 + (long)(iVar37 + -1) + 2];
          ch1[(long)iVar24 + (long)(iVar42 + 3 + iVar28)] =
               cc1[(long)iVar33 + (long)(iVar19 + 1)] + cc1[(long)iVar33 + (long)(iVar37 + -1) + 2];
          ch1[(long)iVar24 + (long)(iVar42 + 2 + iVar28) + 2] =
               cc1[(long)iVar33 + (long)iVar19 + 2] - cc1[(long)iVar33 + (long)iVar37];
          ch1[(long)iVar24 + (long)(iVar13 + 2 + iVar28) + 2] =
               cc1[(long)iVar33 + (long)iVar19 + 2] + cc1[(long)iVar33 + (long)iVar37];
          lVar22 = lVar22 + lVar38;
          iVar28 = iVar28 + iVar11;
          iVar37 = iVar37 + iVar5 * 2;
          iVar19 = iVar19 + iVar5 * 2;
        }
        iVar42 = iVar42 + iVar7;
        iVar13 = iVar13 + iVar7;
        iVar44 = iVar44 + iVar6;
        iVar17 = iVar17 + iVar6;
      }
      iVar47 = iVar47 + iVar18 * -2;
      iVar35 = iVar35 + iVar50;
      iVar29 = iVar29 + iVar14 * -2;
      iVar34 = iVar34 + iVar8;
    }
    if (iVar25 != 1) {
      iVar29 = 0;
      if (0 < iVar40) {
        iVar29 = iVar40;
      }
      uVar15 = (ulong)(iVar29 + 1);
      iVar29 = 0;
      if (0 < iVar25) {
        iVar29 = iVar25;
      }
      iVar24 = ((iVar25 + 1) * iVar40 + 1) * iVar20 * 2 + 2;
      iVar47 = iVar20 * iVar40;
      iVar33 = (uVar10 + 1) * iVar41 * 2 + 2;
      iVar34 = iVar41 * iVar40;
      for (uVar49 = 1; uVar49 != iVar29 + 1; uVar49 = uVar49 + 1) {
        iVar35 = iVar33;
        iVar42 = iVar24;
        for (uVar46 = 1; uVar46 != uVar15; uVar46 = uVar46 + 1) {
          lVar53 = 1;
          iVar17 = iVar35;
          iVar50 = iVar42;
          while( true ) {
            bVar9 = lVar53 <= lVar1;
            if (iVar5 < 0) {
              bVar9 = lVar21 < lVar53;
            }
            if (!bVar9) break;
            cc[(long)iVar16 + (long)(iVar17 + 1)] = ch[(long)iVar31 + (long)(iVar50 + 1)];
            cc[(long)iVar16 + (long)iVar17 + 2] = ch[(long)iVar31 + (long)iVar50 + 2];
            lVar53 = lVar53 + lVar38;
            iVar50 = iVar50 + iVar11;
            iVar17 = iVar17 + iVar5 * 2;
          }
          iVar42 = iVar42 + iVar7;
          iVar35 = iVar35 + iVar6;
        }
        iVar24 = iVar24 + iVar47 * 2;
        iVar33 = iVar33 + iVar34 * iVar30 * 2;
      }
      iVar29 = ((iVar25 * 2 + 1) * iVar40 + 1) * iVar20 * 2 + 2;
      iVar24 = ((iVar30 + 2) * iVar40 + 1) * iVar41 * 2 + 2;
      for (lVar53 = 2; lVar53 <= iVar30; lVar53 = lVar53 + 1) {
        iVar33 = iVar24;
        iVar35 = iVar29;
        for (uVar49 = 1; uVar49 != uVar15; uVar49 = uVar49 + 1) {
          lVar26 = 1;
          iVar42 = iVar33;
          iVar17 = iVar35;
          while( true ) {
            bVar9 = lVar26 <= lVar1;
            if (iVar5 < 0) {
              bVar9 = lVar21 < lVar26;
            }
            if (!bVar9) break;
            cc[(long)iVar16 + (long)(iVar42 + 1)] = ch[(long)iVar31 + (long)(iVar17 + 1)];
            cc[(long)iVar16 + (long)iVar42 + 2] = ch[(long)iVar31 + (long)iVar17 + 2];
            lVar26 = lVar26 + lVar38;
            iVar17 = iVar17 + iVar11;
            iVar42 = iVar42 + iVar5 * 2;
          }
          iVar35 = iVar35 + iVar7;
          iVar33 = iVar33 + iVar6;
        }
        iVar29 = iVar29 + iVar47 * iVar25 * 2;
        iVar24 = iVar24 + iVar34 * 2;
      }
      iVar29 = iVar20 * ((iVar25 * 2 + 2) * iVar40 + 1) * 2 + 2;
      iVar41 = iVar41 * ((iVar30 * 2 + 2) * iVar40 + 1) * 2 + 2;
      for (lVar53 = 2; lVar53 <= iVar30; lVar53 = lVar53 + 1) {
        lVar26 = (iVar12 + lVar53 + -1) * lVar45;
        lVar22 = (iVar39 + lVar53 + -1) * lVar45;
        iVar40 = iVar29;
        iVar20 = iVar41;
        for (lVar27 = 2; lVar27 <= lVar45; lVar27 = lVar27 + 1) {
          iVar24 = iVar40;
          iVar33 = iVar20;
          for (uVar49 = 1; uVar49 != uVar15; uVar49 = uVar49 + 1) {
            lVar32 = 1;
            iVar35 = iVar24;
            iVar42 = iVar33;
            while( true ) {
              bVar9 = lVar32 <= lVar1;
              if (iVar5 < 0) {
                bVar9 = lVar21 < lVar32;
              }
              if (!bVar9) break;
              cc[(long)iVar16 + (long)(iVar42 + 1)] =
                   wa[(long)(int)uVar23 + lVar26 + lVar27] * ch[(long)iVar31 + (long)(iVar35 + 1)] -
                   ch[(long)iVar31 + (long)iVar35 + 2] * wa[(long)(int)uVar23 + lVar22 + lVar27];
              cc[(long)iVar16 + (long)iVar42 + 2] =
                   wa[(long)(int)uVar23 + lVar26 + lVar27] * ch[(long)iVar31 + (long)iVar35 + 2] +
                   wa[(long)(int)uVar23 + lVar22 + lVar27] * ch[(long)iVar31 + (long)(iVar35 + 1)];
              lVar32 = lVar32 + lVar38;
              iVar35 = iVar35 + iVar11;
              iVar42 = iVar42 + iVar5 * 2;
            }
            iVar24 = iVar24 + iVar7;
            iVar33 = iVar33 + iVar6;
          }
          iVar40 = iVar40 + iVar47 * 2;
          iVar20 = iVar20 + iVar34 * iVar30 * 2;
        }
        iVar29 = iVar29 + iVar47 * iVar25 * 2;
        iVar41 = iVar41 + iVar34 * 2;
      }
    }
  }
  return 0;
}

Assistant:

int cmfgkb_(int *lot, int *ido, int *ip, int
	*l1, int *lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *im1,
	int *in1, fft_real_t *ch, fft_real_t *ch1, int *im2, int *in2, fft_real_t *
	wa)
{
    /* System generated locals */
    int ch_dim2, ch_dim3, ch_dim4, ch_offset, cc_dim2, cc_dim3, cc_dim4,
	    cc_offset, cc1_dim2, cc1_dim3, cc1_offset, ch1_dim2, ch1_dim3,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3, i__4,
	    i__5;

    /* Local variables */
     int i__, j, k, l, m1, m2, jc, lc, ki, m1d, m2s;
     fft_real_t wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.0 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim2 = *in1;
    cc1_dim3 = *lid;
    cc1_offset = 1 + 2 * (1 + cc1_dim2 * (1 + cc1_dim3));
    cc1 -= cc1_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ip;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch1_dim2 = *in2;
    ch1_dim3 = *lid;
    ch1_offset = 1 + 2 * (1 + ch1_dim2 * (1 + ch1_dim3));
    ch1 -= ch1_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_dim4 = *ido;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * (1 + ch_dim4)));
    ch -= ch_offset;

    /* Function Body */
    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	m2 = m2s;
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    m2 += *im2;
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 1];
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 2];
/* L110: */
	}
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
/* L112: */
	    }
	}
/* L111: */
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	i__4 = *lid;
	for (ki = 1; ki <= i__4; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__2) {
		m2 += *im2;
		cc1[(m1 + (ki + cc1_dim3) * cc1_dim2 << 1) + 1] += ch1[(m2 + (
			ki + j * ch1_dim3) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + cc1_dim3) * cc1_dim2 << 1) + 2] += ch1[(m2 + (
			ki + j * ch1_dim3) * ch1_dim2 << 1) + 2];
/* L117: */
	    }
	}
/* L118: */
    }
    i__3 = ipph;
    for (l = 2; l <= i__3; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 1] = ch1[(m2
			+ (ki + ch1_dim3) * ch1_dim2 << 1) + 1] + wa[(l - 1 +
			wa_dim2) * wa_dim1 + 1] * ch1[(m2 + (ki + (ch1_dim3 <<
			 1)) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 1] = wa[(l
			- 1 + (wa_dim2 << 1)) * wa_dim1 + 1] * ch1[(m2 + (ki
			+ *ip * ch1_dim3) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 2] = ch1[(m2
			+ (ki + ch1_dim3) * ch1_dim2 << 1) + 2] + wa[(l - 1 +
			wa_dim2) * wa_dim1 + 1] * ch1[(m2 + (ki + (ch1_dim3 <<
			 1)) * ch1_dim2 << 1) + 2];
		cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 2] = wa[(l
			- 1 + (wa_dim2 << 1)) * wa_dim1 + 1] * ch1[(m2 + (ki
			+ *ip * ch1_dim3) * ch1_dim2 << 1) + 2];
/* L113: */
	    }
	}
	i__4 = ipph;
	for (j = 3; j <= i__4; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__1 = *lid;
	    for (ki = 1; ki <= i__1; ++ki) {
		m2 = m2s;
		i__2 = m1d;
		i__5 = *im1;
		for (m1 = 1; i__5 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__5) {
		    m2 += *im2;
		    cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 1] +=
			    war * ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 <<
			    1) + 1];
		    cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 1] +=
			    wai * ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 <<
			     1) + 1];
		    cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 2] +=
			    war * ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 <<
			    1) + 2];
		    cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 2] +=
			    wai * ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 <<
			     1) + 2];
/* L114: */
		}
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1 || *na == 1) {
	goto L136;
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	jc = ipp2 - j;
	i__4 = *lid;
	for (ki = 1; ki <= i__4; ++ki) {
	    i__5 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__5 : m1 <= i__5; m1 += i__2) {
		chold1 = cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1]
			- cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2]
			;
		chold2 = cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1]
			+ cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2]
			;
		cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] = chold1;
		cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] += cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1] = chold2;
/* L119: */
	    }
	}
/* L120: */
    }
    return 0;
L136:
    i__3 = *lid;
    for (ki = 1; ki <= i__3; ++ki) {
	m2 = m2s;
	i__2 = m1d;
	i__5 = *im1;
	for (m1 = 1; i__5 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__5) {
	    m2 += *im2;
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 1];
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 2];
/* L137: */
	}
    }
    i__5 = ipph;
    for (j = 2; j <= i__5; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] - cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] + cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
/* L134: */
	    }
	}
/* L135: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__5 = *ido;
    for (i__ = 1; i__ <= i__5; ++i__) {
	i__4 = *l1;
	for (k = 1; k <= i__4; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__2) {
		m2 += *im2;
		cc[(m1 + (k + (i__ * cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1)
			+ 1] = ch[(m2 + (k + (i__ + ch_dim4) * ch_dim3) *
			ch_dim2 << 1) + 1];
		cc[(m1 + (k + (i__ * cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1)
			+ 2] = ch[(m2 + (k + (i__ + ch_dim4) * ch_dim3) *
			ch_dim2 << 1) + 2];
/* L130: */
	    }
	}
/* L131: */
    }
    i__5 = *ip;
    for (j = 2; j <= i__5; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		cc[(m1 + (k + (j + cc_dim4) * cc_dim3) * cc_dim2 << 1) + 1] =
			ch[(m2 + (k + (j * ch_dim4 + 1) * ch_dim3) * ch_dim2
			<< 1) + 1];
		cc[(m1 + (k + (j + cc_dim4) * cc_dim3) * cc_dim2 << 1) + 2] =
			ch[(m2 + (k + (j * ch_dim4 + 1) * ch_dim3) * ch_dim2
			<< 1) + 2];
/* L122: */
	    }
	}
/* L123: */
    }
    i__5 = *ip;
    for (j = 2; j <= i__5; ++j) {
	i__4 = *ido;
	for (i__ = 2; i__ <= i__4; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		m2 = m2s;
		i__2 = m1d;
		i__1 = *im1;
		for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
		    m2 += *im2;
		    cc[(m1 + (k + (j + i__ * cc_dim4) * cc_dim3) * cc_dim2 <<
			    1) + 1] = wa[i__ + (j - 1 + wa_dim2) * wa_dim1] *
			    ch[(m2 + (k + (i__ + j * ch_dim4) * ch_dim3) *
			    ch_dim2 << 1) + 1] - wa[i__ + (j - 1 + (wa_dim2 <<
			     1)) * wa_dim1] * ch[(m2 + (k + (i__ + j *
			    ch_dim4) * ch_dim3) * ch_dim2 << 1) + 2];
		    cc[(m1 + (k + (j + i__ * cc_dim4) * cc_dim3) * cc_dim2 <<
			    1) + 2] = wa[i__ + (j - 1 + wa_dim2) * wa_dim1] *
			    ch[(m2 + (k + (i__ + j * ch_dim4) * ch_dim3) *
			    ch_dim2 << 1) + 2] + wa[i__ + (j - 1 + (wa_dim2 <<
			     1)) * wa_dim1] * ch[(m2 + (k + (i__ + j *
			    ch_dim4) * ch_dim3) * ch_dim2 << 1) + 1];
/* L124: */
		}
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}